

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PLYReader.cc
# Opt level: O3

void OpenMesh::IO::assignCustomProperty<char>
               (istream *_in,BaseImporter *_bi,VertexHandle _vh,string *_propName)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  reference pvVar2;
  BaseHandle local_30;
  char local_2a;
  value_type local_29 [8];
  char in;
  
  iVar1 = (*_bi->_vptr_BaseImporter[0x19])(_bi);
  local_2a = '\0';
  local_30.idx_ =
       (int)PropertyContainer::handle<char>
                      ((PropertyContainer *)(CONCAT44(extraout_var,iVar1) + 8),&local_2a,_propName);
  if (local_30.idx_ == -1) {
    iVar1 = (*_bi->_vptr_BaseImporter[0x19])(_bi);
    BaseKernel::add_property<char>
              ((BaseKernel *)CONCAT44(extraout_var_00,iVar1),(VPropHandleT<char> *)&local_30,
               _propName);
  }
  std::operator>>(_in,local_29);
  iVar1 = (*_bi->_vptr_BaseImporter[0x19])(_bi);
  pvVar2 = BaseKernel::property<char>
                     ((BaseKernel *)CONCAT44(extraout_var_01,iVar1),
                      (VPropHandleT<char>)local_30.idx_,_vh);
  *pvVar2 = local_29[0];
  return;
}

Assistant:

void assignCustomProperty(std::istream& _in, BaseImporter& _bi, VertexHandle _vh, const std::string& _propName)
{
  OpenMesh::VPropHandleT<T> prop;
  if (!_bi.kernel()->get_property_handle(prop,_propName))
    _bi.kernel()->add_property(prop,_propName);
  T in;
  _in >> in;
  _bi.kernel()->property(prop,_vh) = in;
}